

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::OurReader::decodeDouble(OurReader *this,Token *token,Value *decoded)

{
  int iVar1;
  ValueHolder *this_00;
  ulong __n;
  double value;
  Char buffer [33];
  double local_a0;
  ValueHolder local_98 [2];
  undefined1 local_88 [24];
  ValueHolder local_70 [2];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a0 = 0.0;
  __n = (long)token->end_ - (long)token->start_;
  if ((long)__n < 0) {
    std::__cxx11::string::string
              ((string *)&local_98[0].bool_,"Unable to parse token length",(allocator *)&local_50);
    addError(this,(String *)local_98,token,(Location)0x0);
    this_00 = local_98;
  }
  else {
    if (__n < 0x21) {
      memcpy(local_98,token->start_,__n);
      *(char *)((long)local_98 + __n) = '\0';
      fixNumericLocaleInput<char*>((char *)&local_98[0].int_,(char *)((long)local_98 + __n));
      iVar1 = __isoc99_sscanf(local_98,&DAT_001664d4,&local_a0);
    }
    else {
      local_98[0].string_ = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98);
      iVar1 = __isoc99_sscanf(local_98[0].int_,&DAT_001664d4,&local_a0);
      std::__cxx11::string::~string((string *)&local_98[0].bool_);
    }
    if (iVar1 == 1) {
      Value::Value((Value *)local_98,local_a0);
      Value::operator=(decoded,(Value *)local_98);
      Value::~Value((Value *)local_98);
      return true;
    }
    local_70[0].string_ = (char *)(local_70 + 2);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,token->start_,token->end_);
    std::operator+(&local_50,"\'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   &local_50,"\' is not a number.");
    addError(this,(String *)local_98,token,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_98[0].bool_);
    std::__cxx11::string::~string((string *)&local_50);
    this_00 = local_70;
  }
  std::__cxx11::string::~string((string *)&this_00->bool_);
  return false;
}

Assistant:

bool OurReader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  const int bufferSize = 32;
  int count;
  ptrdiff_t const length = token.end_ - token.start_;

  // Sanity check to avoid buffer overflow exploits.
  if (length < 0) {
    return addError("Unable to parse token length", token);
  }
  auto const ulength = static_cast<size_t>(length);

  // Avoid using a string constant for the format control string given to
  // sscanf, as this can cause hard to debug crashes on OS X. See here for more
  // info:
  //
  //     http://developer.apple.com/library/mac/#DOCUMENTATION/DeveloperTools/gcc-4.0.1/gcc/Incompatibilities.html
  char format[] = "%lf";

  if (length <= bufferSize) {
    Char buffer[bufferSize + 1];
    memcpy(buffer, token.start_, ulength);
    buffer[length] = 0;
    fixNumericLocaleInput(buffer, buffer + length);
    count = sscanf(buffer, format, &value);
  } else {
    String buffer(token.start_, token.end_);
    count = sscanf(buffer.c_str(), format, &value);
  }

  if (count != 1)
    return addError(
        "'" + String(token.start_, token.end_) + "' is not a number.", token);
  decoded = value;
  return true;
}